

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interpreter.c
# Opt level: O3

sysbvm_tuple_t
sysbvm_astMessageChainNode_primitiveAnalyzeAndEvaluate
          (sysbvm_context_t *context,sysbvm_tuple_t closure,size_t argumentCount,
          sysbvm_tuple_t *arguments)

{
  uint uVar1;
  _Bool _Var2;
  sysbvm_tuple_t sVar3;
  ulong uVar4;
  sysbvm_tuple_t sVar5;
  sysbvm_tuple_t sVar6;
  ulong uVar7;
  anon_struct_40_5_24354580 gcFrame;
  sysbvm_stackFrameSourcePositionRecord_t sourcePositionRecord_1;
  sysbvm_stackFrameSourcePositionRecord_t sourcePositionRecord;
  sysbvm_functionCallFrameStack_t callFrameStack;
  long local_210;
  sysbvm_tuple_t local_208;
  sysbvm_tuple_t sStack_200;
  sysbvm_tuple_t local_1f8;
  sysbvm_tuple_t sStack_1f0;
  sysbvm_tuple_t local_1e8;
  sysbvm_tuple_t sStack_1e0;
  sysbvm_tuple_t local_1d8;
  sysbvm_tuple_t sStack_1d0;
  sysbvm_tuple_t local_1c8;
  sysbvm_tuple_t local_1c0;
  sysbvm_tuple_t *local_1b8;
  sysbvm_tuple_t *psStack_1b0;
  sysbvm_tuple_t local_1a8;
  long lStack_1a0;
  sysbvm_tuple_t local_198;
  ulong local_188;
  sysbvm_stackFrameRecord_t local_180;
  undefined8 local_170;
  sysbvm_stackFrameRecord_t local_168;
  undefined8 local_158;
  long *local_150;
  sysbvm_stackFrameRecord_t local_148;
  undefined8 local_138;
  anon_struct_136_2_7a050327_for_gcRoots *local_130;
  sysbvm_stackFrameRecord_t local_128;
  undefined8 local_118;
  sysbvm_tuple_t **local_110;
  sysbvm_stackFrameRecord_t local_100;
  undefined8 local_f0;
  sysbvm_functionCallFrameStack_t local_e8;
  
  if (argumentCount != 2) {
    sysbvm_error_argumentCountMismatch(2,argumentCount);
  }
  local_110 = &local_1b8;
  local_1a8 = 0;
  lStack_1a0 = 0;
  local_1b8 = (sysbvm_tuple_t *)0x0;
  psStack_1b0 = (sysbvm_tuple_t *)0x0;
  local_198 = 0;
  local_128.previous = (sysbvm_stackFrameRecord_s *)0x0;
  local_128.type = SYSBVM_STACK_FRAME_RECORD_TYPE_GC_ROOTS;
  local_128._12_4_ = 0;
  local_118 = 5;
  sysbvm_stackFrame_pushRecord(&local_128);
  local_100.previous = (sysbvm_stackFrameRecord_s *)0x0;
  local_100.type = SYSBVM_STACK_FRAME_RECORD_TYPE_SOURCE_POSITION;
  local_f0 = *(undefined8 *)(*arguments + 0x10);
  sysbvm_stackFrame_pushRecord(&local_100);
  sVar3 = *arguments;
  sVar6 = *(sysbvm_tuple_t *)(sVar3 + 0x28);
  if (sVar6 != 0) {
    local_1b8 = (sysbvm_tuple_t *)
                sysbvm_interpreter_analyzeAndEvaluateASTWithEnvironment(context,sVar6,arguments[1]);
    uVar7 = (ulong)local_1b8 & 0xf;
    if (uVar7 == 0 && local_1b8 != (sysbvm_tuple_t *)0x0) {
      psStack_1b0 = (sysbvm_tuple_t *)*local_1b8;
    }
    else if ((int)uVar7 == 0xf) {
      psStack_1b0 = (sysbvm_tuple_t *)
                    sysbvm_tuple_getImmediateTrivialTypeWithIndex(context,(ulong)local_1b8 >> 4);
    }
    else {
      psStack_1b0 = (sysbvm_tuple_t *)sysbvm_tuple_getImmediateTypeWithTag(context,uVar7);
    }
    uVar7 = (ulong)psStack_1b0 & 0xf;
    if (uVar7 == 0 && psStack_1b0 != (sysbvm_tuple_t *)0x0) {
      sVar3 = *psStack_1b0;
    }
    else if ((int)uVar7 == 0xf) {
      sVar3 = sysbvm_tuple_getImmediateTrivialTypeWithIndex(context,(ulong)psStack_1b0 >> 4);
    }
    else {
      sVar3 = sysbvm_tuple_getImmediateTypeWithTag(context,uVar7);
    }
    local_1a8 = sysbvm_type_getAnalyzeAndEvaluateMessageChainNodeForReceiverWithEnvironmentFunction
                          (context,sVar3);
    if (local_1a8 != 0) {
      sysbvm_stackFrame_popRecord(&local_128);
      local_e8._8_8_ = *arguments;
      local_e8.variadicArgumentIndex = arguments[1];
      local_e8.expectedArgumentCount = (size_t)local_1b8;
      local_e8.applicationFlags = (sysbvm_bitflags_t)psStack_1b0;
      sVar3 = sysbvm_function_apply(context,local_1a8,4,&local_e8.applicationFlags,0);
      return sVar3;
    }
    sVar3 = *arguments;
    local_1a8 = 0;
  }
  uVar7 = *(ulong *)(sVar3 + 0x38);
  if (((uVar7 & 0xf) == 0 && uVar7 != 0) && (uVar1 = *(uint *)(uVar7 + 0xc), 7 < uVar1)) {
    local_188 = (ulong)(sVar6 != 0);
    uVar7 = 0;
    local_1c0 = sVar6;
    do {
      uVar4 = *(ulong *)(*arguments + 0x38);
      if ((uVar4 & 0xf) == 0 && uVar4 != 0) {
        local_210 = *(long *)(uVar4 + 0x10 + uVar7 * 8);
      }
      else {
        local_210 = 0;
      }
      local_1c8 = 0;
      local_1d8 = 0;
      sStack_1d0 = 0;
      local_1e8 = 0;
      sStack_1e0 = 0;
      local_1f8 = 0;
      sStack_1f0 = 0;
      local_208 = 0;
      sStack_200 = 0;
      local_168.previous = (sysbvm_stackFrameRecord_s *)0x0;
      local_168.type = SYSBVM_STACK_FRAME_RECORD_TYPE_GC_ROOTS;
      local_168._12_4_ = 0;
      local_158 = 10;
      local_150 = &local_210;
      lStack_1a0 = local_210;
      sysbvm_stackFrame_pushRecord(&local_168);
      local_180.previous = (sysbvm_stackFrameRecord_s *)0x0;
      local_180.type = SYSBVM_STACK_FRAME_RECORD_TYPE_SOURCE_POSITION;
      local_170 = *(undefined8 *)(local_210 + 0x10);
      sysbvm_stackFrame_pushRecord(&local_180);
      local_208 = sysbvm_interpreter_analyzeAndEvaluateASTWithEnvironment
                            (context,*(sysbvm_tuple_t *)(local_210 + 0x28),arguments[1]);
      uVar4 = *(ulong *)(local_210 + 0x30);
      sVar3 = 0;
      if ((uVar4 & 0xf) == 0 && uVar4 != 0) {
        sVar3 = (sysbvm_tuple_t)(*(uint *)(uVar4 + 0xc) >> 3);
      }
      if (sVar6 == 0) {
        _Var2 = sysbvm_environment_lookSymbolRecursively(context,arguments[1],local_208,&local_1f8);
        if ((!_Var2) || (_Var2 = sysbvm_symbolBinding_isValue(context,local_1f8), !_Var2)) {
          sysbvm_error("Failed to find symbol for message send without receiver.");
        }
        if (((local_1f8 & 0xf) == 0 && local_1f8 != 0) && (0x57 < *(uint *)(local_1f8 + 0xc))) {
          sStack_1f0 = *(sysbvm_tuple_t *)(local_1f8 + 0x38);
        }
        else {
          sStack_1f0 = 0;
        }
LAB_00125ca2:
        memset(&local_e8,0,0xb0);
        local_148.previous = (sysbvm_stackFrameRecord_s *)0x0;
        local_148.type = SYSBVM_STACK_FRAME_RECORD_TYPE_GC_ROOTS;
        local_148._12_4_ = 0;
        local_138 = 0x11;
        local_130 = &local_e8.gcRoots;
        sysbvm_stackFrame_pushRecord(&local_148);
        sysbvm_functionCallFrameStack_begin(context,&local_e8,sStack_1f0,local_188 + sVar3,0);
        if (sVar6 != 0) {
          sysbvm_functionCallFrameStack_push(&local_e8,(sysbvm_tuple_t)local_1b8);
        }
        if (sVar3 != 0) {
          sVar6 = 0;
          do {
            uVar4 = *(ulong *)(local_210 + 0x30);
            if ((uVar4 & 0xf) == 0 && uVar4 != 0) {
              sStack_1d0 = *(sysbvm_tuple_t *)(uVar4 + 0x10 + sVar6 * 8);
            }
            else {
              sStack_1d0 = 0;
            }
            local_1c8 = sysbvm_interpreter_analyzeAndEvaluateASTWithEnvironment
                                  (context,sStack_1d0,arguments[1]);
            sysbvm_functionCallFrameStack_push(&local_e8,local_1c8);
            sVar6 = sVar6 + 1;
          } while (sVar3 != sVar6);
        }
        sysbvm_stackFrame_popRecord(&local_148);
        local_1e8 = sysbvm_functionCallFrameStack_finish(context,&local_e8);
        sysbvm_stackFrame_popRecord(&local_180);
        sysbvm_stackFrame_popRecord(&local_168);
        sVar6 = local_1c0;
      }
      else {
        uVar4 = (ulong)local_1b8 & 0xf;
        if (uVar4 == 0 && local_1b8 != (sysbvm_tuple_t *)0x0) {
          sStack_200 = *local_1b8;
        }
        else if ((int)uVar4 == 0xf) {
          sStack_200 = sysbvm_tuple_getImmediateTrivialTypeWithIndex(context,(ulong)local_1b8 >> 4);
        }
        else {
          sStack_200 = sysbvm_tuple_getImmediateTypeWithTag(context,uVar4);
        }
        sStack_1f0 = sysbvm_type_lookupSelector(context,sStack_200,local_208);
        if (sStack_1f0 != 0) goto LAB_00125ca2;
        sStack_1f0 = sysbvm_type_lookupSelector
                               (context,sStack_200,(context->roots).doesNotUnderstandSelector);
        if (sStack_1f0 == 0) {
          sysbvm_error("Message not understood.");
        }
        local_1d8 = sysbvm_array_create(context,sVar3);
        if (sVar3 != 0) {
          sVar5 = 0;
          do {
            uVar4 = *(ulong *)(local_210 + 0x30);
            if ((uVar4 & 0xf) == 0 && uVar4 != 0) {
              sStack_1d0 = *(sysbvm_tuple_t *)(uVar4 + 0x10 + sVar5 * 8);
            }
            else {
              sStack_1d0 = 0;
            }
            local_1c8 = sysbvm_interpreter_analyzeAndEvaluateASTWithEnvironment
                                  (context,sStack_1d0,arguments[1]);
            if ((local_1c8 & 0xf) == 0 && local_1c8 != 0) {
              *(sysbvm_tuple_t *)(local_1c8 + 0x10 + sVar5 * 8) = local_1c8;
            }
            sVar5 = sVar5 + 1;
            sVar6 = local_1c0;
          } while (sVar3 != sVar5);
        }
        sStack_1e0 = sysbvm_message_create
                               (context,local_208,local_1d8,sStack_200,
                                *(sysbvm_tuple_t *)(local_210 + 0x10));
        local_e8.applicationFlags = (sysbvm_bitflags_t)local_1b8;
        local_e8._8_8_ = sStack_1e0;
        local_1e8 = sysbvm_function_apply(context,sStack_1f0,2,&local_e8.applicationFlags,0);
        sysbvm_stackFrame_popRecord(&local_180);
        sysbvm_stackFrame_popRecord(&local_168);
      }
      local_198 = local_1e8;
      uVar7 = uVar7 + 1;
    } while (uVar7 != uVar1 >> 3);
  }
  sysbvm_stackFrame_popRecord(&local_100);
  sysbvm_stackFrame_popRecord(&local_128);
  return local_198;
}

Assistant:

static sysbvm_tuple_t sysbvm_astMessageChainNode_primitiveAnalyzeAndEvaluate(sysbvm_context_t *context, sysbvm_tuple_t closure, size_t argumentCount, sysbvm_tuple_t *arguments)
{
    (void)context;
    (void)closure;
    if(argumentCount != 2) sysbvm_error_argumentCountMismatch(2, argumentCount);

    sysbvm_tuple_t *node = &arguments[0];
    sysbvm_tuple_t *environment = &arguments[1];

    sysbvm_astMessageChainNode_t **chainNode = (sysbvm_astMessageChainNode_t**)node;

    struct {
        sysbvm_tuple_t receiver;
        sysbvm_tuple_t receiverType;
        sysbvm_tuple_t analysisFunction;
        sysbvm_tuple_t chainedMessage;
        sysbvm_tuple_t result;
    } gcFrame = {0};
    SYSBVM_STACKFRAME_PUSH_GC_ROOTS(gcFrameRecord, gcFrame);
    SYSBVM_STACKFRAME_PUSH_SOURCE_POSITION(sourcePositionRecord, (*chainNode)->super.sourcePosition);

    bool hasReceiver = false;
    if((*chainNode)->receiver)
    {
        gcFrame.receiver = sysbvm_interpreter_analyzeAndEvaluateASTWithEnvironment(context, (*chainNode)->receiver, *environment);
        hasReceiver = true;

        gcFrame.receiverType = sysbvm_tuple_getType(context, gcFrame.receiver);
        gcFrame.analysisFunction = sysbvm_type_getAnalyzeAndEvaluateMessageChainNodeForReceiverWithEnvironmentFunction(context, sysbvm_tuple_getType(context, gcFrame.receiverType));
        if(gcFrame.analysisFunction)
        {
            SYSBVM_STACKFRAME_POP_GC_ROOTS(gcFrameRecord);
            return sysbvm_function_apply4(context, gcFrame.analysisFunction, gcFrame.receiverType, *node, gcFrame.receiver, *environment);
        }
    }

    size_t chainedMessageCount = sysbvm_array_getSize((*chainNode)->messages);
    for(size_t i = 0; i < chainedMessageCount; ++i)
    {
        gcFrame.chainedMessage = sysbvm_array_at((*chainNode)->messages, i);
        gcFrame.result = sysbvm_astMessageChainMessageNode_analyzeAndEvaluate(context, gcFrame.chainedMessage, hasReceiver, &gcFrame.receiver, environment);
    }

    SYSBVM_STACKFRAME_POP_SOURCE_POSITION(sourcePositionRecord);
    SYSBVM_STACKFRAME_POP_GC_ROOTS(gcFrameRecord);
    return gcFrame.result;
}